

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O0

void __thiscall
OperandEquation::operandOrder
          (OperandEquation *this,Constructor *ct,
          vector<OperandSymbol_*,_std::allocator<OperandSymbol_*>_> *order)

{
  bool bVar1;
  OperandSymbol *local_28;
  OperandSymbol *sym;
  vector<OperandSymbol_*,_std::allocator<OperandSymbol_*>_> *order_local;
  Constructor *ct_local;
  OperandEquation *this_local;
  
  sym = (OperandSymbol *)order;
  order_local = (vector<OperandSymbol_*,_std::allocator<OperandSymbol_*>_> *)ct;
  ct_local = (Constructor *)this;
  local_28 = Constructor::getOperand(ct,this->index);
  bVar1 = OperandSymbol::isMarked(local_28);
  if (!bVar1) {
    std::vector<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>::push_back
              ((vector<OperandSymbol_*,_std::allocator<OperandSymbol_*>_> *)sym,&local_28);
    OperandSymbol::setMark(local_28);
  }
  return;
}

Assistant:

void OperandEquation::operandOrder(Constructor *ct,vector<OperandSymbol *> &order) const

{
  OperandSymbol *sym = ct->getOperand(index);
  if (!sym->isMarked()) {
    order.push_back(sym);
    sym->setMark();
  }
}